

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrcmap.c
# Opt level: O0

FT_UInt32 pfr_cmap_char_next(PFR_CMap cmap,FT_UInt32 *pchar_code)

{
  FT_UInt FVar1;
  PFR_Char gchar;
  uint local_28;
  FT_UInt mid;
  FT_UInt max;
  FT_UInt min;
  FT_UInt32 char_code;
  FT_UInt result;
  FT_UInt32 *pchar_code_local;
  PFR_CMap cmap_local;
  
  max = *pchar_code;
  do {
    min = 0;
    max = max + 1;
    mid = 0;
    FVar1 = cmap->num_chars;
    while( true ) {
      local_28 = FVar1;
      if (local_28 <= mid) {
        max = 0;
        if (mid < cmap->num_chars) {
          min = mid;
          if (mid != 0) {
            min = mid + 1;
            max = cmap->chars[mid].char_code;
          }
        }
        goto LAB_00166f34;
      }
      FVar1 = mid + (local_28 - mid >> 1);
      if (cmap->chars[FVar1].char_code == max) break;
      if (cmap->chars[FVar1].char_code < max) {
        mid = FVar1 + 1;
        FVar1 = local_28;
      }
    }
  } while (FVar1 == 0);
  min = FVar1 + 1;
LAB_00166f34:
  *pchar_code = max;
  return min;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  pfr_cmap_char_next( PFR_CMap    cmap,
                      FT_UInt32  *pchar_code )
  {
    FT_UInt    result    = 0;
    FT_UInt32  char_code = *pchar_code + 1;


  Restart:
    {
      FT_UInt   min = 0;
      FT_UInt   max = cmap->num_chars;
      FT_UInt   mid;
      PFR_Char  gchar;


      while ( min < max )
      {
        mid   = min + ( ( max - min ) >> 1 );
        gchar = cmap->chars + mid;

        if ( gchar->char_code == char_code )
        {
          result = mid;
          if ( result != 0 )
          {
            result++;
            goto Exit;
          }

          char_code++;
          goto Restart;
        }

        if ( gchar->char_code < char_code )
          min = mid + 1;
        else
          max = mid;
      }

      /* we didn't find it, but we have a pair just above it */
      char_code = 0;

      if ( min < cmap->num_chars )
      {
        gchar  = cmap->chars + min;
        result = min;
        if ( result != 0 )
        {
          result++;
          char_code = gchar->char_code;
        }
      }
    }

  Exit:
    *pchar_code = char_code;
    return result;
  }